

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
userDefinedUnits_definitionStrings_Test::~userDefinedUnits_definitionStrings_Test
          (userDefinedUnits_definitionStrings_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(userDefinedUnits, definitionStrings)
{
    precise_unit idgit(4.754, mol / m.pow(2));
    addUserDefinedUnit("idgit", idgit);

    auto ipm = unit_from_string("idgit/min");
    EXPECT_EQ(ipm, idgit / minute);

    auto str = to_string(ipm);
    EXPECT_EQ(str, "idgit/min");

    str = to_string(ipm.inv());
    EXPECT_EQ(str, "min/idgit");
    clearUserDefinedUnits();
}